

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

Logger * LogInstance(void)

{
  long lVar1;
  int iVar2;
  Logger *this;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (LogInstance()::g_logger == '\0') {
    iVar2 = __cxa_guard_acquire(&LogInstance()::g_logger);
    if (iVar2 != 0) {
      this = (Logger *)operator_new(0x108);
      memset(this,0,0x108);
      BCLog::Logger::Logger(this);
      LogInstance::g_logger = this;
      __cxa_guard_release(&LogInstance()::g_logger);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return LogInstance::g_logger;
  }
  __stack_chk_fail();
}

Assistant:

BCLog::Logger& LogInstance()
{
/**
 * NOTE: the logger instances is leaked on exit. This is ugly, but will be
 * cleaned up by the OS/libc. Defining a logger as a global object doesn't work
 * since the order of destruction of static/global objects is undefined.
 * Consider if the logger gets destroyed, and then some later destructor calls
 * LogPrintf, maybe indirectly, and you get a core dump at shutdown trying to
 * access the logger. When the shutdown sequence is fully audited and tested,
 * explicit destruction of these objects can be implemented by changing this
 * from a raw pointer to a std::unique_ptr.
 * Since the ~Logger() destructor is never called, the Logger class and all
 * its subclasses must have implicitly-defined destructors.
 *
 * This method of initialization was originally introduced in
 * ee3374234c60aba2cc4c5cd5cac1c0aefc2d817c.
 */
    static BCLog::Logger* g_logger{new BCLog::Logger()};
    return *g_logger;
}